

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

void cmSystemTools::Glob(string *directory,string *regexp,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *files)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  uint uVar4;
  unsigned_long dindex;
  Directory d;
  string fname;
  RegularExpression reg;
  allocator<char> local_131;
  Directory local_130;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  RegularExpression local_100;
  
  local_128 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  cmsys::Directory::Directory(&local_130);
  pcVar3 = (regexp->_M_dataplus)._M_p;
  local_100.regmatch.startp[0] = (char *)0x0;
  local_100.regmatch.endp[0] = (char *)0x0;
  local_100.regmatch.searchstring = (char *)0x0;
  local_100.program = (char *)0x0;
  if (pcVar3 != (char *)0x0) {
    cmsys::RegularExpression::compile(&local_100,pcVar3);
  }
  bVar1 = cmsys::Directory::Load(&local_130,directory);
  if (bVar1) {
    uVar2 = cmsys::Directory::GetNumberOfFiles(&local_130);
    if (uVar2 != 0) {
      uVar4 = 1;
      dindex = 0;
      do {
        pcVar3 = cmsys::Directory::GetFile(&local_130,dindex);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,pcVar3,&local_131);
        bVar1 = cmsys::RegularExpression::find
                          (&local_100,local_120._M_dataplus._M_p,&local_100.regmatch);
        if (bVar1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_128,&local_120);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        dindex = (unsigned_long)uVar4;
        uVar4 = uVar4 + 1;
      } while (dindex < uVar2);
    }
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  cmsys::Directory::~Directory(&local_130);
  return;
}

Assistant:

void cmSystemTools::Glob(const std::string& directory,
                         const std::string& regexp,
                         std::vector<std::string>& files)
{
  cmsys::Directory d;
  cmsys::RegularExpression reg(regexp.c_str());

  if (d.Load(directory)) {
    size_t numf;
    unsigned int i;
    numf = d.GetNumberOfFiles();
    for (i = 0; i < numf; i++) {
      std::string fname = d.GetFile(i);
      if (reg.find(fname)) {
        files.push_back(std::move(fname));
      }
    }
  }
}